

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# minmax.cpp
# Opt level: O2

void duckdb::MaxOperation::Combine<duckdb::MinMaxState<unsigned_char>,duckdb::MaxOperation>
               (MinMaxState<unsigned_char> *source,MinMaxState<unsigned_char> *target,
               AggregateInputData *param_3)

{
  if (source->isset == true) {
    if (target->isset == false) {
      *target = *source;
      return;
    }
    if (target->value < source->value) {
      target->value = source->value;
    }
  }
  return;
}

Assistant:

static void Combine(const STATE &source, STATE &target, AggregateInputData &) {
		if (!source.isset) {
			// source is NULL, nothing to do
			return;
		}
		if (!target.isset) {
			// target is NULL, use source value directly
			target = source;
		} else if (LessThan::Operation(target.value, source.value)) {
			target.value = source.value;
		}
	}